

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

void ts_subtree__compress
               (MutableSubtree self,uint count,TSLanguage *language,MutableSubtreeArray *stack)

{
  TSSymbol TVar1;
  uint uVar2;
  uint32_t uVar3;
  Subtree *pSVar4;
  MutableSubtree MVar5;
  Subtree SVar6;
  MutableSubtree MVar7;
  MutableSubtree self_00;
  uint uVar8;
  MutableSubtree grandchild_1;
  MutableSubtree child_1;
  MutableSubtree grandchild;
  MutableSubtree child;
  uint i;
  TSSymbol symbol;
  MutableSubtree tree;
  uint initial_stack_size;
  MutableSubtreeArray *stack_local;
  TSLanguage *language_local;
  uint count_local;
  MutableSubtree self_local;
  
  uVar2 = stack->size;
  TVar1 = (self.ptr)->symbol;
  child._0_4_ = 0;
  _i = self;
  while (((((((uint)child._0_4_ < count && (_i->ref_count < 2)) && (1 < _i->child_count)) &&
           ((MVar5 = ts_subtree_to_mut_unsafe(*(_i->field_17).field_0.children),
            ((ulong)MVar5.ptr & 1) == 0 && (1 < (MVar5.ptr)->child_count)))) &&
          (((MVar5.ptr)->ref_count < 2 &&
           (((MVar5.ptr)->symbol == TVar1 &&
            (MVar7 = ts_subtree_to_mut_unsafe(*((MVar5.ptr)->field_17).field_0.children),
            ((ulong)MVar7.ptr & 1) == 0)))))) &&
         ((1 < (MVar7.ptr)->child_count &&
          (((MVar7.ptr)->ref_count < 2 && ((MVar7.ptr)->symbol == TVar1))))))) {
    pSVar4 = (_i->field_17).field_0.children;
    SVar6 = ts_subtree_from_mut(MVar7);
    *pSVar4 = SVar6;
    *((MVar5.ptr)->field_17).field_0.children =
         ((MVar7.ptr)->field_17).field_0.children[(MVar7.ptr)->child_count - 1];
    pSVar4 = ((MVar7.ptr)->field_17).field_0.children;
    uVar3 = (MVar7.ptr)->child_count;
    SVar6 = ts_subtree_from_mut(MVar5);
    pSVar4[uVar3 - 1] = SVar6;
    array__grow((VoidArray *)stack,8);
    uVar8 = stack->size;
    stack->size = uVar8 + 1;
    stack->contents[uVar8].ptr = (SubtreeHeapData *)_i;
    child._0_4_ = child._0_4_ + 1;
    _i = MVar7;
  }
  while (uVar2 < stack->size) {
    uVar8 = stack->size - 1;
    stack->size = uVar8;
    MVar5 = (MutableSubtree)stack->contents[uVar8].ptr;
    MVar7 = ts_subtree_to_mut_unsafe(*((MVar5.ptr)->field_17).field_0.children);
    self_00 = ts_subtree_to_mut_unsafe
                        (((MVar7.ptr)->field_17).field_0.children[(MVar7.ptr)->child_count - 1]);
    ts_subtree_set_children
              (self_00,((self_00.ptr)->field_17).field_0.children,(self_00.ptr)->child_count,
               language);
    ts_subtree_set_children
              (MVar7,((MVar7.ptr)->field_17).field_0.children,(MVar7.ptr)->child_count,language);
    ts_subtree_set_children
              (MVar5,((MVar5.ptr)->field_17).field_0.children,(MVar5.ptr)->child_count,language);
  }
  return;
}

Assistant:

static void ts_subtree__compress(MutableSubtree self, unsigned count, const TSLanguage *language,
                                 MutableSubtreeArray *stack) {
  unsigned initial_stack_size = stack->size;

  MutableSubtree tree = self;
  TSSymbol symbol = tree.ptr->symbol;
  for (unsigned i = 0; i < count; i++) {
    if (tree.ptr->ref_count > 1 || tree.ptr->child_count < 2) break;

    MutableSubtree child = ts_subtree_to_mut_unsafe(tree.ptr->children[0]);
    if (
      child.data.is_inline ||
      child.ptr->child_count < 2 ||
      child.ptr->ref_count > 1 ||
      child.ptr->symbol != symbol
    ) break;

    MutableSubtree grandchild = ts_subtree_to_mut_unsafe(child.ptr->children[0]);
    if (
      grandchild.data.is_inline ||
      grandchild.ptr->child_count < 2 ||
      grandchild.ptr->ref_count > 1 ||
      grandchild.ptr->symbol != symbol
    ) break;

    tree.ptr->children[0] = ts_subtree_from_mut(grandchild);
    child.ptr->children[0] = grandchild.ptr->children[grandchild.ptr->child_count - 1];
    grandchild.ptr->children[grandchild.ptr->child_count - 1] = ts_subtree_from_mut(child);
    array_push(stack, tree);
    tree = grandchild;
  }

  while (stack->size > initial_stack_size) {
    tree = array_pop(stack);
    MutableSubtree child = ts_subtree_to_mut_unsafe(tree.ptr->children[0]);
    MutableSubtree grandchild = ts_subtree_to_mut_unsafe(child.ptr->children[child.ptr->child_count - 1]);
    ts_subtree_set_children(grandchild, grandchild.ptr->children, grandchild.ptr->child_count, language);
    ts_subtree_set_children(child, child.ptr->children, child.ptr->child_count, language);
    ts_subtree_set_children(tree, tree.ptr->children, tree.ptr->child_count, language);
  }
}